

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall common_log::~common_log(common_log *this)

{
  common_log *in_RDI;
  vector<common_log_entry,_std::allocator<common_log_entry>_> *unaff_retaddr;
  
  pause(in_RDI);
  if (in_RDI->file != (FILE *)0x0) {
    fclose((FILE *)in_RDI->file);
  }
  common_log_entry::~common_log_entry((common_log_entry *)0x117109);
  std::vector<common_log_entry,_std::allocator<common_log_entry>_>::~vector(unaff_retaddr);
  std::condition_variable::~condition_variable(&in_RDI->cv);
  std::thread::~thread((thread *)0x117133);
  return;
}

Assistant:

~common_log() {
        pause();
        if (file) {
            fclose(file);
        }
    }